

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

bool __thiscall
absl::lts_20250127::container_internal::
btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_*>
::Equals(btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_*>
         *this,const_iterator other)

{
  bool bVar1;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *node_b;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *node_a;
  anon_class_1_0_00000001 local_19;
  
  node_b = other.node_;
  node_a = this->node_;
  if (node_a == (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                 *)0x0 &&
      node_b == (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                 *)0x0) {
    node_a = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
              *)0x0;
  }
  else if ((node_a == (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                       *)0x0) ||
          (node_b == (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                      *)0x0)) {
    Equals::anon_class_1_0_00000001::operator()(&local_19);
    node_a = this->node_;
  }
  bVar1 = AreNodesFromSameContainer<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
                    (node_a,node_b);
  if (bVar1) {
    return this->position_ == other.position_ && this->node_ == node_b;
  }
  __assert_fail("AreNodesFromSameContainer(node_, other.node_) && \"Comparing iterators from different containers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                ,0x4e2,
                "bool absl::container_internal::btree_iterator<const absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>, 256, false>>, const std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo> &, const std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo> *>::Equals(const const_iterator) const [Node = const absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>, 256, false>>, Reference = const std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo> &, Pointer = const std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo> *]"
               );
}

Assistant:

bool Equals(const const_iterator other) const {
    ABSL_HARDENING_ASSERT(((node_ == nullptr && other.node_ == nullptr) ||
                           (node_ != nullptr && other.node_ != nullptr)) &&
                          "Comparing default-constructed iterator with "
                          "non-default-constructed iterator.");
    // Note: we use assert instead of ABSL_HARDENING_ASSERT here because this
    // changes the complexity of Equals from O(1) to O(log(N) + log(M)) where
    // N/M are sizes of the containers containing node_/other.node_.
    assert(AreNodesFromSameContainer(node_, other.node_) &&
           "Comparing iterators from different containers.");
    assert_valid_generation(node_);
    other.assert_valid_generation(other.node_);
    return node_ == other.node_ && position_ == other.position_;
  }